

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedThread.hpp
# Opt level: O1

void __thiscall crsGA::ScopedThread::~ScopedThread(ScopedThread *this)

{
  if ((this->_t)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->_t)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

~ScopedThread()
    {
        if (_t.joinable())
            _t.join();
    }